

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testPipelineQueryPrograms
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  CallLogWrapper *this_00;
  GLuint pipeline;
  Pipeline *pPVar1;
  GLint GVar2;
  GLenum GVar3;
  int iVar4;
  ProgramWrapper *pPVar5;
  GLint queryFrg;
  GLint queryVtx;
  ProgramParams pipePp;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  in_stack_ffffffffffffff88;
  GLint local_68;
  GLint local_64;
  string local_60;
  ProgramParams local_40;
  
  local_40 = genProgramParams(&this->m_rnd);
  createPipeline((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                  *)&local_60,this,&local_40);
  local_60._M_dataplus._M_p = (pointer)0x0;
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::operator=(pipeOut,in_stack_ffffffffffffff88);
  pPVar1 = (pipeOut->
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           ).m_data.ptr;
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::reset((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           *)&local_60);
  pipeline = *(GLuint *)
              ((long)(pPVar1->pipeline).
                     super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                     .m_data.ptr + 8);
  local_64 = 0;
  local_68 = 0;
  this_00 = &this->super_CallLogWrapper;
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glGetProgramPipelineiv(this_00,pipeline,0x8b31,&local_64);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"glGetProgramPipelineiv(pipeName, GL_VERTEX_SHADER, &queryVtx)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                  ,0x5b9);
  GVar2 = local_64;
  (this->super_CallLogWrapper).m_enableLog = false;
  pPVar5 = (pPVar1->vtxProg).
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           .m_data.ptr;
  if (pPVar5 == (ProgramWrapper *)0x0) {
    pPVar5 = (pPVar1->fullProg).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             .m_data.ptr;
  }
  iVar4 = (*pPVar5->_vptr_ProgramWrapper[2])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Program pipeline query reported wrong vertex shader program",
             (allocator<char> *)&stack0xffffffffffffff97);
  tcu::ResultCollector::check(&this->m_status,GVar2 == iVar4,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glGetProgramPipelineiv(this_00,pipeline,0x8b30,&local_68);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"glGetProgramPipelineiv(pipeName, GL_FRAGMENT_SHADER, &queryFrg)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                  ,0x5bd);
  GVar2 = local_68;
  (this->super_CallLogWrapper).m_enableLog = false;
  pPVar5 = (pPVar1->frgProg).
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           .m_data.ptr;
  if (pPVar5 == (ProgramWrapper *)0x0) {
    pPVar5 = (pPVar1->fullProg).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             .m_data.ptr;
  }
  iVar4 = (*pPVar5->_vptr_ProgramWrapper[2])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Program pipeline query reported wrong fragment shader program",
             (allocator<char> *)&stack0xffffffffffffff97);
  tcu::ResultCollector::check(&this->m_status,GVar2 == iVar4,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void SeparateShaderTest::testPipelineQueryPrograms (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				pipePp		= genProgramParams(m_rnd);
	Pipeline&					pipeline	= *(pipeOut = createPipeline(pipePp));
	GLuint						pipeName	= pipeline.pipeline->getPipeline();
	GLint						queryVtx	= 0;
	GLint						queryFrg	= 0;

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_VERTEX_SHADER, &queryVtx)));
	m_status.check(GLuint(queryVtx) == pipeline.getVertexProgram().getProgramName(),
				   "Program pipeline query reported wrong vertex shader program");

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_FRAGMENT_SHADER, &queryFrg)));
	m_status.check(GLuint(queryFrg) == pipeline.getFragmentProgram().getProgramName(),
				   "Program pipeline query reported wrong fragment shader program");
}